

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O3

void sigfiddle_freebird(t_sigfiddle *x)

{
  if (x->x_inbuf != (t_float *)0x0) {
    freebytes(x->x_inbuf,(long)x->x_hop << 2);
    x->x_inbuf = (t_float *)0x0;
  }
  if (x->x_lastanalysis != (t_float *)0x0) {
    freebytes(x->x_lastanalysis,(long)x->x_hop * 8 + 0x50);
    x->x_lastanalysis = (t_float *)0x0;
  }
  if (x->x_spiral != (t_float *)0x0) {
    freebytes(x->x_spiral,(long)x->x_hop << 3);
    x->x_spiral = (t_float *)0x0;
  }
  x->x_hop = 0;
  return;
}

Assistant:

static void sigfiddle_freebird(t_sigfiddle *x)
{
    if (x->x_inbuf)
    {
        freebytes(x->x_inbuf, sizeof(t_float) * x->x_hop);
        x->x_inbuf = 0;
    }
    if (x->x_lastanalysis)
    {
        freebytes(x->x_lastanalysis,
            sizeof(t_float) * (2 * x->x_hop + 4 * FILTSIZE));
        x->x_lastanalysis = 0;
    }
    if (x->x_spiral)
    {
        freebytes(x->x_spiral, sizeof(t_float) * 2 * x->x_hop);
        x->x_spiral = 0;
    }
    x->x_hop = 0;
}